

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_mutex_extension.h
# Opt level: O0

void __thiscall dlib::auto_mutex::unlock(auto_mutex *this)

{
  read_write_mutex *in_RDI;
  rmutex *unaff_retaddr;
  
  if (*(long *)in_RDI == 0) {
    if (*(long *)(in_RDI + 8) == 0) {
      if (*(long *)(in_RDI + 0x10) != 0) {
        read_write_mutex::unlock(in_RDI);
        *(undefined8 *)(in_RDI + 0x10) = 0;
      }
    }
    else {
      rmutex::unlock(unaff_retaddr,(unsigned_long)in_RDI);
      *(undefined8 *)(in_RDI + 8) = 0;
    }
  }
  else {
    mutex::unlock((mutex *)0x263fc6);
    *(undefined8 *)in_RDI = 0;
  }
  return;
}

Assistant:

void unlock()
        {
            if (m != 0)
            {
                m->unlock();
                m = 0;
            }
            else if (r != 0)
            {
                r->unlock();
                r = 0;
            }
            else if (rw != 0)
            {
                rw->unlock();
                rw = 0;
            }
        }